

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall value_values::test_method(value_values *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *__x;
  size_t sVar4;
  Value vvs;
  undefined4 uStack_37c;
  shared_count local_370;
  Value vvalues;
  Values values;
  undefined **local_338;
  ulong local_330;
  shared_count sStack_328;
  char **local_320;
  Value vd1;
  Value vs1;
  double d1;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  string s1;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  output_test_stream output;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s1,"value #1",(allocator<char> *)&output);
  d1 = 0.3;
  dynamicgraph::command::Value::Value(&vs1,(string *)&s1);
  dynamicgraph::command::Value::Value(&vd1,&d1);
  values.
  super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
  push_back(&values,&vs1);
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
  push_back(&values,&vd1);
  dynamicgraph::command::Value::Value(&vvalues,(vector *)&values);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x194);
  _output = &PTR__lazy_ostream_00112c80;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_2d8 = "";
  uVar3 = dynamicgraph::command::Value::type();
  local_338 = (undefined **)CONCAT44(local_338._4_4_,uVar3);
  _vvs = (char *)CONCAT44(uStack_37c,0xc);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,dynamicgraph::command::Value::Type,dynamicgraph::command::Value::Type>
            (&output,&local_2e0,0x194,1,2,&local_338,"vvalues.type()",&vvs,"Value::VALUES");
  __x = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *)
        dynamicgraph::command::Value::constValuesValue();
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x198);
  _output = &PTR__lazy_ostream_00112c80;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1f8 = "";
  local_338 = (undefined **)
              ((long)(__x->
                     super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(__x->
                     super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4);
  _vvs = (char *)((long)values.
                        super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)values.
                        super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&output,&local_200,0x198,1,2,&local_338,"vs.size()",&vvs,"values.size()");
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x199);
  bVar1 = std::operator==(__x,&values);
  local_330 = 0;
  sStack_328.pi_ = (sp_counted_base *)0x0;
  _vvs = "vs == values";
  _output = &PTR__lazy_ostream_00112c30;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_228 = "";
  local_338._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_328);
  dynamicgraph::command::Value::Value(&vvs,&vvalues);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x1a3);
  uVar2 = dynamicgraph::command::Value::operator==(&vvs,&vvalues);
  local_338 = (undefined **)CONCAT71(local_338._1_7_,uVar2);
  local_330 = 0;
  sStack_328.pi_ = (sp_counted_base *)0x0;
  local_2f0 = "vvs == vvalues";
  local_2e8 = "";
  _output = &PTR__lazy_ostream_00112c30;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_258 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_328);
  dynamicgraph::command::Value::~Value(&vvs);
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_270,1);
  dynamicgraph::command::operator<<((ostream *)&output,&vvalues);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1ad);
  local_2a0 = 
  "Type=values, value=[ Value(Type=string, value=value #1), Value(Type=double, value=0.3), ]";
  sVar4 = boost::unit_test::ut_detail::bcs_char_traits_impl<const_char>::length
                    (
                    "Type=values, value=[ Value(Type=string, value=value #1), Value(Type=double, value=0.3), ]"
                    );
  local_298 = "Type=values, value=[ Value(Type=string, value=value #1), Value(Type=double, value=0.3), ]"
              + sVar4;
  boost::test_tools::output_test_stream::is_equal(&vvs,&output,&local_2a0,1);
  local_2f0 = 
  "output.is_equal(\"Type=values, value=[ \" \"Value(Type=string, value=value #1), \" \"Value(Type=double, value=0.3), \" \"]\")"
  ;
  local_2e8 = "";
  local_330 = local_330 & 0xffffffffffffff00;
  local_338 = &PTR__lazy_ostream_00112c30;
  sStack_328.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_2a8 = "";
  local_320 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion(&vvs,&local_338,&local_2b0,0x1ad,1,0,0);
  boost::detail::shared_count::~shared_count(&local_370);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  dynamicgraph::command::Value::~Value(&vvalues);
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::~vector
            (&values);
  dynamicgraph::command::Value::~Value(&vd1);
  dynamicgraph::command::Value::~Value(&vs1);
  std::__cxx11::string::~string((string *)&s1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_values) {
  using namespace dynamicgraph::command;

  std::string s1("value #1");
  double d1 = 0.3;

  Value vs1(s1);
  Value vd1(d1);

  Values values;
  values.push_back(vs1);
  values.push_back(vd1);

  Value vvalues(values);

  BOOST_CHECK_EQUAL(vvalues.type(), Value::VALUES);

  {  // Const ref
    const Values &vs = vvalues.constValuesValue();
    BOOST_CHECK_EQUAL(vs.size(), values.size());
    BOOST_CHECK(vs == values);
  }
  {
      // Cast does not work.
      // dg::command::EitherType eitherType (vvalues);
      // Values vs = static_cast<Values>(eitherType);
      // BOOST_CHECK_EQUAL(vs.size(), values.size());
      // BOOST_CHECK(vs == values);
  } {  // Constructor
    Value vvs(vvalues);
    BOOST_CHECK(vvs == vvalues);
  }

  {
    output_test_stream output;
    output << vvalues;
    BOOST_CHECK(
        output.is_equal("Type=values, value=[ "
                        "Value(Type=string, value=value #1), "
                        "Value(Type=double, value=0.3), "
                        "]"));
  }
}